

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O0

ulong mcmcsiz(mcmcxdef *cctx)

{
  ulong tot;
  mcmhdef *p;
  mcmcx1def *ctx;
  mcmcxdef *cctx_local;
  
  tot = 0;
  for (p = cctx->mcmcxgl->mcmcxhpch; p != (mcmhdef *)0x0; p = p->mcmhnxt) {
    tot = tot + 0x8000;
  }
  return tot;
}

Assistant:

ulong mcmcsiz(mcmcxdef *cctx)
{
    mcmcx1def *ctx = cctx->mcmcxgl;
    mcmhdef   *p;
    ulong      tot;
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    /* count number of heaps, adding in chunk size for each */
    for (tot = 0, p = ctx->mcmcxhpch ; p ; p = p->mcmhnxt)
        tot += MCMCHUNK;
    
    return(tot);
}